

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm-start.h
# Opt level: O2

bool __thiscall WarmStartBrancher::finished(WarmStartBrancher *this)

{
  char *pcVar1;
  lbool lVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  Lit *pLVar7;
  
  bVar4 = true;
  if (engine.conflicts <= this->init_conflicts) {
    uVar5 = (this->decs).sz;
    uVar6 = this->pos;
    if ((int)uVar6 < (int)uVar5) {
      pLVar7 = (this->decs).data;
      cVar3 = -sat.assigns.data[(uint)(pLVar7[uVar6].x >> 1)];
      if ((pLVar7[uVar6].x & 1U) == 0) {
        cVar3 = sat.assigns.data[(uint)(pLVar7[uVar6].x >> 1)];
      }
      if (cVar3 == ::l_Undef.value) {
        bVar4 = false;
      }
      else {
        pcVar1 = sat.assigns.data;
        lVar2.value = ::l_Undef.value;
        if (engine.conflicts < this->init_conflicts) {
          trailSave<int>(&this->pos);
          uVar5 = (this->decs).sz;
          uVar6 = this->pos;
          pLVar7 = (this->decs).data;
          pcVar1 = sat.assigns.data;
          lVar2 = ::l_Undef;
        }
        do {
          uVar6 = uVar6 + 1;
          this->pos = uVar6;
          bVar4 = (int)uVar5 <= (int)uVar6;
          if ((int)uVar5 <= (int)uVar6) {
            return bVar4;
          }
          cVar3 = -pcVar1[(uint)(pLVar7[uVar6].x >> 1)];
          if ((pLVar7[uVar6].x & 1U) == 0) {
            cVar3 = pcVar1[(uint)(pLVar7[uVar6].x >> 1)];
          }
        } while (cVar3 != lVar2.value);
      }
    }
  }
  return bVar4;
}

Assistant:

bool finished() override {
		// Already deactivated
		if (engine.conflicts > init_conflicts) {
			return true;
		}

		if (pos < static_cast<int>(decs.size())) {
			if (sat.value(decs[pos]) == l_Undef) {
				return false;
			}
			if (engine.conflicts < init_conflicts) {
				trailSave(pos);
			}
			for (++pos; pos < static_cast<int>(decs.size()); ++pos) {
				if (sat.value(decs[pos]) == l_Undef) {
					return false;
				}
			}
		}
		return true;
	}